

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O0

void __thiscall cmFileInstaller::~cmFileInstaller(cmFileInstaller *this)

{
  cmFileInstaller *this_local;
  
  ~cmFileInstaller(this);
  operator_delete(this,0x148);
  return;
}

Assistant:

cmFileInstaller::~cmFileInstaller()
{
  // Save the updated install manifest.
  this->Makefile->AddDefinition("CMAKE_INSTALL_MANIFEST_FILES",
                                this->Manifest);
}